

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcOdc.c
# Opt level: O2

int Abc_NtkDontCareSimulateBefore(Odc_Man_t *p,uint *puTruth)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  iVar1 = p->nBits;
  iVar2 = p->nWords;
  iVar5 = 0;
  iVar4 = 2;
  while (bVar6 = iVar4 != 0, iVar4 = iVar4 + -1, bVar6) {
    Abc_NtkDontCareSimulateSetRand(p);
    Abc_NtkDontCareSimulate(p,puTruth);
    iVar3 = Abc_NtkDontCareCountMintsWord(p,puTruth);
    iVar5 = iVar5 + iVar3;
  }
  return ((iVar1 / iVar2) * iVar5) / 2;
}

Assistant:

int Abc_NtkDontCareSimulateBefore( Odc_Man_t * p, unsigned * puTruth )
{
    int nIters = 2;
    int nRounds, Counter, r;
    // decide how many rounds to simulate
    nRounds = p->nBits / p->nWords;
    Counter = 0;
    for ( r = 0; r < nIters; r++ )
    {
        Abc_NtkDontCareSimulateSetRand( p );
        Abc_NtkDontCareSimulate( p, puTruth );
        Counter += Abc_NtkDontCareCountMintsWord( p, puTruth );
    }
    // normalize
    Counter = Counter * nRounds / nIters;
    return Counter;
}